

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O0

size_t string_to_size_t(string *str)

{
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  size_t local_18;
  size_t result;
  string *str_local;
  
  result = (size_t)str;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,(string *)str);
  std::istream::operator>>((istream *)local_1a0,&local_18);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return local_18;
}

Assistant:

size_t string_to_size_t(std::string str) {
    size_t result;
    std::stringstream ss;
    ss << str;
    ss >> result;
    return result;
}